

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O0

uint fl_utf8froma(char *dst,uint dstlen,char *src,uint srclen)

{
  byte bVar1;
  char *pcVar2;
  uint uVar3;
  uint local_44;
  uchar ucs_1;
  uchar ucs;
  uint count;
  char *e;
  char *p;
  uint srclen_local;
  char *src_local;
  uint dstlen_local;
  char *dst_local;
  
  local_44 = 0;
  uVar3 = local_44;
  e = src;
  if (dstlen != 0) {
    do {
      while( true ) {
        local_44 = uVar3;
        if (src + srclen <= e) {
          dst[local_44] = '\0';
          return local_44;
        }
        pcVar2 = e + 1;
        bVar1 = *e;
        e = pcVar2;
        if (bVar1 < 0x80) break;
        if (dstlen <= local_44 + 2) {
          dst[local_44] = '\0';
          local_44 = local_44 + 2;
          goto LAB_001fc3ab;
        }
        dst[local_44] = (byte)((int)(uint)bVar1 >> 6) | 0xc0;
        dst[local_44 + 1] = bVar1 & 0x3f | 0x80;
        uVar3 = local_44 + 2;
      }
      uVar3 = local_44 + 1;
      dst[local_44] = bVar1;
    } while (uVar3 < dstlen);
    dst[local_44] = '\0';
    local_44 = uVar3;
  }
LAB_001fc3ab:
  while (e < src + srclen) {
    if ((byte)*e < 0x80) {
      local_44 = local_44 + 1;
      e = e + 1;
    }
    else {
      local_44 = local_44 + 2;
      e = e + 1;
    }
  }
  return local_44;
}

Assistant:

unsigned fl_utf8froma(char* dst, unsigned dstlen,
		   const char* src, unsigned srclen) {
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned char ucs;
    if (p >= e) {dst[count] = 0; return count;}
    ucs = *(const unsigned char*)p++;
    if (ucs < 0x80U) {
      dst[count++] = ucs;
      if (count >= dstlen) {dst[count-1] = 0; break;}
    } else { /* 2 bytes (note that CP1252 translate could make 3 bytes!) */
      if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
      dst[count++] = 0xc0 | (ucs >> 6);
      dst[count++] = 0x80 | (ucs & 0x3F);
    }
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    unsigned char ucs = *(const unsigned char*)p++;
    if (ucs < 0x80U) {
      count++;
    } else {
      count += 2;
    }
  }
  return count;
}